

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::error
          (BuildSystemFrontendDelegate *this,StringRef filename,Token *at,Twine *message)

{
  void *pvVar1;
  ArrayRef<llvm::SMFixIt> FixIts;
  ArrayRef<llvm::SMFixIt> FixIts_00;
  bool bVar2;
  uint uVar3;
  pointer this_00;
  FileSystem *pFVar4;
  pointer pMVar5;
  size_t sVar6;
  char *pcVar7;
  SourceMgr *pSVar8;
  ArrayRef<llvm::SMFixIt> local_100;
  ArrayRef<llvm::SMRange> local_f0;
  SMLoc local_e0;
  ArrayRef<llvm::SMFixIt> local_d8;
  ArrayRef<llvm::SMRange> local_c8;
  SMLoc local_b8;
  SMLoc local_b0;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_a8;
  char *local_a0;
  char *local_98;
  uint local_8c;
  undefined1 local_88 [4];
  uint offset;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_68;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> buffer;
  SMRange range;
  SMLoc loc;
  BuildSystemFrontendDelegateImpl *impl;
  Twine *message_local;
  Token *at_local;
  BuildSystemFrontendDelegate *this_local;
  StringRef filename_local;
  
  filename_local.Data = (char *)filename.Length;
  this_local = (BuildSystemFrontendDelegate *)filename.Data;
  pvVar1 = this->impl;
  std::__atomic_base<unsigned_int>::operator++((__atomic_base<unsigned_int> *)((long)pvVar1 + 0x18))
  ;
  memset(&range.End,0,8);
  llvm::SMLoc::SMLoc(&range.End);
  memset(&buffer,0,0x10);
  llvm::SMRange::SMRange((SMRange *)&buffer);
  filename_local.Length = (size_t)&this_local;
  if ((filename_local.Data != (char *)0x0) && (at->start != (char *)0x0)) {
    this_00 = std::
              unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
              ::operator->((unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                            *)(*(long *)((long)pvVar1 + 0x30) + 0x20));
    pFVar4 = BuildSystem::getFileSystem(this_00);
    llvm::StringRef::operator_cast_to_string((string *)local_88,(StringRef *)&this_local);
    (*pFVar4->_vptr_FileSystem[4])(&local_68,pFVar4,local_88);
    std::__cxx11::string::~string((string *)local_88);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_68);
    if (bVar2) {
      local_8c = (int)at->start - (int)*(undefined8 *)((long)pvVar1 + 8);
      uVar3 = local_8c + at->length;
      pMVar5 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
               operator->(&local_68);
      sVar6 = llvm::MemoryBuffer::getBufferSize(pMVar5);
      if (uVar3 < sVar6) {
        pMVar5 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
                 operator->(&local_68);
        pcVar7 = llvm::MemoryBuffer::getBufferStart(pMVar5);
        local_98 = (char *)llvm::SMLoc::getFromPointer(pcVar7 + local_8c);
        buffer._M_t.
        super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
        super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
        super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>
              )(__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>
                )local_98;
        range.End = (SMLoc)local_98;
        pMVar5 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
                 operator->(&local_68);
        pcVar7 = llvm::MemoryBuffer::getBufferStart(pMVar5);
        local_a0 = (char *)llvm::SMLoc::getFromPointer(pcVar7 + (local_8c + at->length));
        range.Start = (SMLoc)local_a0;
        pSVar8 = getSourceMgr(this);
        std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::unique_ptr
                  (&local_a8,&local_68);
        memset(&local_b0,0,8);
        llvm::SMLoc::SMLoc(&local_b0);
        llvm::SourceMgr::AddNewSourceBuffer(pSVar8,&local_a8,local_b0);
        std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
                  (&local_a8);
      }
    }
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
              (&local_68);
  }
  bVar2 = llvm::SMLoc::isValid((SMLoc *)&buffer);
  if (bVar2) {
    pSVar8 = getSourceMgr(this);
    local_b8.Ptr = range.End.Ptr;
    llvm::ArrayRef<llvm::SMRange>::ArrayRef(&local_c8,(SMRange *)&buffer);
    llvm::ArrayRef<llvm::SMFixIt>::ArrayRef(&local_d8,None);
    FixIts.Length = local_d8.Length;
    FixIts.Data = local_d8.Data;
    llvm::SourceMgr::PrintMessage(pSVar8,local_b8,DK_Error,message,local_c8,FixIts,true);
  }
  else {
    pSVar8 = getSourceMgr(this);
    local_e0.Ptr = range.End.Ptr;
    llvm::ArrayRef<llvm::SMRange>::ArrayRef(&local_f0,None);
    llvm::ArrayRef<llvm::SMFixIt>::ArrayRef(&local_100,None);
    FixIts_00.Length = local_100.Length;
    FixIts_00.Data = local_100.Data;
    llvm::SourceMgr::PrintMessage(pSVar8,local_e0,DK_Error,message,local_f0,FixIts_00,true);
  }
  fflush(_stderr);
  return;
}

Assistant:

void
BuildSystemFrontendDelegate::error(StringRef filename,
                                   const Token& at,
                                   const Twine& message) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  
  ++impl->numErrors;

  // If we have a file and token, resolve the location and range to one
  // accessible by the source manager.
  //
  // FIXME: We shouldn't need to do this, but should switch llbuild to using
  // SourceMgr natively.
  llvm::SMLoc loc{};
  llvm::SMRange range{};
  if (!filename.empty() && at.start) {
    // FIXME: We ignore errors here, for now, this will be resolved when we move
    // to SourceMgr completely.
    auto buffer = impl->frontend->system->getFileSystem().getFileContents(filename);
    if (buffer) {
      unsigned offset = at.start - impl->bufferBeingParsed.data();
      if (offset + at.length < buffer->getBufferSize()) {
        range.Start = loc = llvm::SMLoc::getFromPointer(
            buffer->getBufferStart() + offset);
        range.End = llvm::SMLoc::getFromPointer(
            buffer->getBufferStart() + (offset + at.length));
        getSourceMgr().AddNewSourceBuffer(std::move(buffer), llvm::SMLoc{});
      }
    }
  }

  if (range.Start.isValid()) {
    getSourceMgr().PrintMessage(loc, llvm::SourceMgr::DK_Error, message, range);
  } else {
    getSourceMgr().PrintMessage(loc, llvm::SourceMgr::DK_Error, message);
  }
  fflush(stderr);
}